

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::setReverbEnabled(QSynth *this,bool reverbEnabled)

{
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  bool reverbEnabled_local;
  QSynth *this_local;
  
  synthLocker._15_1_ = reverbEnabled;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::setReverbEnabled(this->realtimeHelper,(bool)(synthLocker._15_1_ & 1));
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    bVar1 = isOpen(this);
    if (bVar1) {
      MT32Emu::Synth::setReverbEnabled(this->synth,(bool)(synthLocker._15_1_ & 1));
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::setReverbEnabled(bool reverbEnabled) {
	if (isRealtime()) {
		realtimeHelper->setReverbEnabled(reverbEnabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setReverbEnabled(reverbEnabled);
	}
}